

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtphashtable.h
# Opt level: O0

int __thiscall
jrtplib::RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>::
GotoElement(RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
            *this,uint *e)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  bool bVar4;
  bool found;
  int index;
  uint *e_local;
  RTPHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317> *this_local;
  
  iVar2 = RTPUDPv4Trans_GetHashIndex_uint32_t::GetIndex(e);
  if (iVar2 < 0x207d) {
    this->curhashelem = this->table[iVar2];
    bVar1 = false;
    while( true ) {
      bVar4 = false;
      if (!bVar1) {
        bVar4 = this->curhashelem != (HashElement *)0x0;
      }
      if (!bVar4) break;
      puVar3 = HashElement::GetElement(this->curhashelem);
      if (*puVar3 == *e) {
        bVar1 = true;
      }
      else {
        this->curhashelem = this->curhashelem->hashnext;
      }
    }
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = -5;
    }
  }
  else {
    this_local._4_4_ = -6;
  }
  return this_local._4_4_;
}

Assistant:

inline int RTPHashTable<Element,GetIndex,hashsize>::GotoElement(const Element &e)
{
	int index;
	bool found;
	
	index = GetIndex::GetIndex(e);
	if (index >= hashsize)
		return ERR_RTP_HASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	curhashelem = table[index]; 
	found = false;
	while(!found && curhashelem != 0)
	{
		if (curhashelem->GetElement() == e)
			found = true;
		else
			curhashelem = curhashelem->hashnext;
	}
	if (!found)
		return ERR_RTP_HASHTABLE_ELEMENTNOTFOUND;
	return 0;
}